

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgd-walk.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  nettlp *__buf;
  uintptr_t *puVar2;
  uint16_t devn;
  uint16_t busn;
  int local_11c;
  uintptr_t vaddr;
  uintptr_t addr;
  nettlp nt;
  task_struct t;
  
  nt.remote_addr.s_addr = 0;
  nt.local_addr.s_addr = 0;
  nt.requester = 0;
  nt.tag = '\0';
  nt._11_1_ = 0;
  nt.dir = DMA_ISSUED_BY_LIBTLP;
  nt.sockfd = 0;
  nt.port = 0;
  nt._22_2_ = 0;
  addr = 0;
  busn = 0;
  devn = 0;
  vaddr = 0;
  local_11c = -1;
LAB_00102c57:
  do {
    iVar1 = getopt(argc,argv,"r:l:b:t:a:p:v:");
    switch(iVar1) {
    case 0x6c:
      __buf = (nettlp *)&nt.local_addr;
      break;
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_00102c73_caseD_6d:
      usage();
      return -1;
    case 0x70:
      local_11c = atoi(_optarg);
      goto LAB_00102c57;
    case 0x72:
      __buf = &nt;
      break;
    case 0x74:
      iVar1 = atoi(_optarg);
      nt.tag = (uint8_t)iVar1;
      goto LAB_00102c57;
    case 0x76:
      puVar2 = &vaddr;
      goto LAB_00102d0d;
    default:
      if (iVar1 == 0x61) {
        puVar2 = &addr;
LAB_00102d0d:
        __isoc99_sscanf(_optarg,"0x%lx",puVar2);
      }
      else {
        if (iVar1 != 0x62) {
          if (iVar1 == -1) {
            iVar1 = nettlp_init(&nt);
            if (iVar1 < 0) {
              perror("nettlp_init");
              return iVar1;
            }
            fill_task_struct(&nt,addr,&t);
            task(&nt,t.vhead,t.vchildren,local_11c,vaddr);
            return 0;
          }
          goto switchD_00102c73_caseD_6d;
        }
        __isoc99_sscanf(_optarg,"%hx:%hx",&busn,&devn);
        nt.requester = busn << 8 | devn;
      }
      goto LAB_00102c57;
    }
    iVar1 = inet_pton(2,_optarg,__buf);
    if (iVar1 < 1) {
      perror("inet_pton");
      return -1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, pid;
	struct nettlp nt;
	uintptr_t addr, vaddr;
	uint16_t busn, devn;
	struct task_struct t;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	pid = -1;	/* not mached */
	vaddr = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:p:v:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			pid = atoi(optarg);
			break;

		case 'v':
			ret = sscanf(optarg, "0x%lx", &vaddr);
			break;

		default :
			usage();
			return -1;
		}
	}


	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}

	fill_task_struct(&nt, addr, &t);

	task(&nt, t.vhead, t.vchildren, pid, vaddr);
	//print_task_struct(&nt, t);
	//dump_task_struct(&t);

	return 0;
}